

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

void __thiscall lzham::search_accelerator::reset(search_accelerator *this)

{
  uint uVar1;
  uint *puVar2;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x3d8) = 0;
  *(undefined4 *)(in_RDI + 0x3dc) = 0;
  *(undefined4 *)(in_RDI + 0x3e0) = 0;
  *(undefined8 *)(in_RDI + 0x3f8) = 0;
  uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x48));
  if (uVar1 != 0) {
    puVar2 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)(in_RDI + 0x48));
    uVar1 = vector<unsigned_int>::size_in_bytes((vector<unsigned_int> *)(in_RDI + 0x48));
    memset(puVar2,0,(ulong)uVar1);
  }
  uVar1 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0xa8));
  if (uVar1 != 0) {
    puVar2 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)(in_RDI + 0xa8));
    uVar1 = vector<unsigned_int>::size_in_bytes((vector<unsigned_int> *)(in_RDI + 0xa8));
    memset(puVar2,0,(ulong)uVar1);
  }
  return;
}

Assistant:

void search_accelerator::reset()
   {
      m_cur_dict_size = 0;
      m_lookahead_size = 0;
      m_lookahead_pos = 0;
      m_fill_lookahead_pos = 0;
      m_fill_lookahead_size = 0;
      m_fill_dict_size = 0;
      m_num_completed_helper_threads = 0;

      // Clearing the hash tables is only necessary for determinism (otherwise, it's possible the matches returned after a reset will depend on the data processes before the reset).
      if (m_hash.size()) 
         memset(m_hash.get_ptr(), 0, m_hash.size_in_bytes());
      
      if (m_digram_hash.size())
         memset(m_digram_hash.get_ptr(), 0, m_digram_hash.size_in_bytes());
      
      // Shouldn't be necessary
      //if (m_deterministic)
      //   memset(m_nodes.get_ptr(), 0, m_nodes.size_in_bytes());
   }